

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::api::HDWalletApi::GetPrivkeyFromExtkey
          (HDWalletApi *this,string *extkey,NetType net_type,bool wif,bool is_compressed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  NetType in_ECX;
  CfdException *in_RDX;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  Privkey privkey;
  uint32_t check_version;
  ExtPrivkey ext_privkey;
  ExtPrivkey *in_stack_fffffffffffffea0;
  Privkey local_118;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [36];
  uint32_t local_cc;
  CfdSourceLocation local_c8;
  uint32_t local_9c;
  ExtPrivkey local_98;
  byte local_1e;
  byte local_1d;
  NetType local_1c;
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_1c = in_ECX;
  core::ExtPrivkey::ExtPrivkey(&local_98,(string *)in_RDX);
  local_9c = GetExtkeyVersion(kExtPrivkey,local_1c);
  uVar1 = core::ExtPrivkey::GetVersion(&local_98);
  if (uVar1 != local_9c) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x134;
    local_c8.funcname = "GetPrivkeyFromExtkey";
    uVar2 = core::ExtPrivkey::GetVersion(&local_98);
    local_cc = uVar2;
    core::logger::warn<unsigned_int>(&local_c8,"Version unmatch. key version: {}",&local_cc);
    local_f2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"extkey networkType unmatch.",&local_f1);
    core::CfdException::CfdException(in_RDX,in_ECX,(string *)CONCAT44(uVar1,uVar2));
    local_f2 = 0;
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ExtPrivkey::GetPrivkey(&local_118,&local_98);
  if ((local_1d & 1) == 0) {
    core::Privkey::GetHex_abi_cxx11_(in_RDI,&local_118);
  }
  else {
    core::Privkey::ConvertWif_abi_cxx11_(in_RDI,&local_118,local_1c,(bool)(local_1e & 1));
  }
  core::Privkey::~Privkey((Privkey *)0x63e603);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffea0);
  return in_RDI;
}

Assistant:

std::string HDWalletApi::GetPrivkeyFromExtkey(
    const std::string& extkey, NetType net_type, bool wif,
    bool is_compressed) const {
  ExtPrivkey ext_privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (ext_privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        ext_privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }

  Privkey privkey = ext_privkey.GetPrivkey();
  if (wif) {
    return privkey.ConvertWif(net_type, is_compressed);
  } else {
    return privkey.GetHex();
  }
}